

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_def.c
# Opt level: O2

str_t * newstr(upb_DefBuilder *ctx,char *data,size_t len)

{
  str_t *psVar1;
  
  psVar1 = (str_t *)_upb_DefBuilder_Alloc(ctx,len + 0x10);
  if (psVar1 != (str_t *)0x0) {
    psVar1->len = len;
    if (len != 0) {
      memcpy(psVar1->str,data,len);
    }
    psVar1->str[len] = '\0';
    return psVar1;
  }
  _upb_DefBuilder_OomErr(ctx);
}

Assistant:

static str_t* newstr(upb_DefBuilder* ctx, const char* data, size_t len) {
  str_t* ret = _upb_DefBuilder_Alloc(ctx, sizeof(*ret) + len);
  if (!ret) _upb_DefBuilder_OomErr(ctx);
  ret->len = len;
  if (len) memcpy(ret->str, data, len);
  ret->str[len] = '\0';
  return ret;
}